

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O2

void __thiscall
blcl::net::connection<MsgType>::add_to_incoming_messages_queue(connection<MsgType> *this)

{
  tsqueue<blcl::net::owned_message<MsgType>_> *this_00;
  owned_message<MsgType> local_48;
  
  this_00 = this->incoming_messages_;
  if (this->owner_type_ == server) {
    std::__shared_ptr<blcl::net::connection<MsgType>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<blcl::net::connection<MsgType>,void>
              ((__shared_ptr<blcl::net::connection<MsgType>,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<blcl::net::connection<MsgType>_>);
    message<MsgType>::message(&local_48.msg,&this->current_incoming_message_);
    tsqueue<blcl::net::owned_message<MsgType>_>::push_back(this_00,&local_48);
  }
  else {
    local_48.remote.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_48.remote.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    message<MsgType>::message(&local_48.msg,&this->current_incoming_message_);
    tsqueue<blcl::net::owned_message<MsgType>_>::push_back(this_00,&local_48);
  }
  owned_message<MsgType>::~owned_message(&local_48);
  read_header(this);
  return;
}

Assistant:

void add_to_incoming_messages_queue() {
            if (owner_type_ == owner::server)
                incoming_messages_.push_back({ this->shared_from_this(), current_incoming_message_ });
            else
                incoming_messages_.push_back({ nullptr, current_incoming_message_ });

            read_header();
        }